

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::NullLength::Run(NullLength *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint index;
  long lVar2;
  allocator<char> local_465;
  GLint res;
  string expected;
  GLenum prop;
  GLchar name [1024];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(name,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&expected,this);
  program = PIQBase::CreateProgram
                      ((PIQBase *)this,(char *)name._0_8_,expected._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)name);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  memset((string *)name,0,0x400);
  index = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,program,0x92e4,"color");
  prop = 0x92fb;
  glu::CallLogWrapper::glGetProgramResourceName(this_00,program,0x92e4,0,0x400,(GLsizei *)0x0,name);
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e4,index,1,&prop,1,(GLsizei *)0x0,&res);
  std::__cxx11::string::string<std::allocator<char>>((string *)&expected,"color",&local_465);
  bVar1 = std::operator!=(name,&expected);
  if (bVar1) {
    anon_unknown_0::Output("Expected name: %s, got: %s\n",expected._M_dataplus._M_p,name);
  }
  else {
    if (res == 1) {
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      lVar2 = 0;
      goto LAB_00c36f94;
    }
    anon_unknown_0::Output("Expected array_size: 1, got: %d\n");
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  lVar2 = -1;
LAB_00c36f94:
  std::__cxx11::string::~string((string *)&expected);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		GLchar name[1024] = { '\0' };
		GLuint index	  = glGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, "color");
		GLenum prop		  = GL_ARRAY_SIZE;
		GLint  res;
		glGetProgramResourceName(program, GL_PROGRAM_OUTPUT, 0, 1024, NULL, name);
		glGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, index, 1, &prop, 1, NULL, &res);

		std::string expected = "color";
		if (name != expected)
		{
			Output("Expected name: %s, got: %s\n", expected.c_str(), name);
			glDeleteProgram(program);
			return ERROR;
		}
		else if (res != 1)
		{
			Output("Expected array_size: 1, got: %d\n", res);
			glDeleteProgram(program);
			return ERROR;
		}

		glDeleteProgram(program);
		return NO_ERROR;
	}